

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O3

void __thiscall Chromosome::createCoordinatePath(Chromosome *this,Coordinate start)

{
  pointer *ppCVar1;
  pointer pTVar2;
  FACING FVar3;
  Coordinate *pCVar4;
  iterator iVar5;
  pointer pTVar6;
  Coordinate next;
  Coordinate local_58;
  Coordinate local_48;
  vector<Coordinate,std::allocator<Coordinate>> *local_38;
  
  local_48.facing = start.facing;
  local_48._0_8_ = start._0_8_;
  pCVar4 = (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5._M_current =
       (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current != pCVar4) {
    (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar4;
    iVar5._M_current = pCVar4;
  }
  local_38 = (vector<Coordinate,std::allocator<Coordinate>> *)&this->pathList;
  if (iVar5._M_current ==
      (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Coordinate,std::allocator<Coordinate>>::_M_realloc_insert<Coordinate_const&>
              (local_38,iVar5,&local_48);
  }
  else {
    (iVar5._M_current)->facing = local_48.facing;
    (iVar5._M_current)->x = local_48.x;
    (iVar5._M_current)->y = local_48.y;
    ppCVar1 = &(this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  pTVar6 = (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (this->turnList).super__Vector_base<TURNCODE,_std::allocator<TURNCODE>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pTVar6 == pTVar2) {
      return;
    }
    local_58.facing = local_48.facing + *pTVar6;
    local_58.x = local_48.x;
    local_58.y = local_48.y;
    if (local_58.facing == 4) {
      local_58.facing = NORTH;
    }
    if (local_58.facing == ~NORTH) {
      local_58.facing = WEST;
    }
    pCVar4 = &local_58;
    FVar3 = local_58.facing;
    switch(local_58.facing) {
    case NORTH:
      FVar3 = EAST;
      goto LAB_0010a53a;
    case EAST:
      break;
    case SOUTH:
      FVar3 = ~NORTH;
LAB_0010a53a:
      pCVar4 = (Coordinate *)&local_58.y;
      break;
    case WEST:
      FVar3 = ~NORTH;
      pCVar4 = &local_58;
      break;
    default:
      goto switchD_0010a52c_default;
    }
    *(FACING *)pCVar4 = pCVar4->x + FVar3;
switchD_0010a52c_default:
    iVar5._M_current =
         (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Coordinate,std::allocator<Coordinate>>::_M_realloc_insert<Coordinate_const&>
                (local_38,iVar5,&local_58);
    }
    else {
      (iVar5._M_current)->facing = local_58.facing;
      (iVar5._M_current)->x = local_58.x;
      (iVar5._M_current)->y = local_58.y;
      ppCVar1 = &(this->pathList).super__Vector_base<Coordinate,_std::allocator<Coordinate>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppCVar1 = *ppCVar1 + 1;
    }
    pTVar6 = pTVar6 + 1;
    local_48._0_8_ = local_58._0_8_;
    local_48.facing = local_58.facing;
  } while( true );
}

Assistant:

void Chromosome::createCoordinatePath(Coordinate start) {
    pathList.clear();
    Coordinate current = start;
    pathList.push_back(current);
    for (auto turn: turnList){
        Coordinate next = current;
        next.turnTo(turn);
        pathList.push_back(next);
        current = next;
    }
}